

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O1

int bcf_get_info_values(bcf_hdr_t *hdr,bcf1_t *line,char *tag,void **dst,int *ndst,int type)

{
  uint8_t uVar1;
  short sVar2;
  uint8_t *puVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint uVar6;
  uint uVar7;
  anon_union_4_2_947300a4_for_v1 aVar8;
  void *pvVar9;
  undefined8 *puVar10;
  ulong uVar11;
  anon_union_4_2_947300a4_for_v1 *paVar12;
  long *plVar13;
  long *plVar14;
  bcf_info_t *pbVar15;
  char *id;
  bcf_fmt_t *pbVar16;
  ulong uVar17;
  int iVar18;
  bcf1_t *b;
  undefined1 *__size;
  bcf_hdr_t *h;
  uint32_t uVar19;
  int *piVar20;
  long lVar21;
  long lVar22;
  size_t __size_00;
  
  piVar20 = ndst;
  uVar6 = bcf_hdr_id2int(hdr,0,tag);
  uVar17 = 0xffffffff;
  if ((((int)uVar6 < 0) || (uVar7 = (hdr->id[0][uVar6].val)->info[1], (~uVar7 & 0xf) == 0)) ||
     (uVar17 = 0xfffffffe, (uVar7 >> 4 & 0xf) != type)) goto switchD_00124ab3_caseD_4;
  if ((line->unpacked & 4) == 0) {
    bcf_unpack(line,4);
  }
  uVar17 = *(ulong *)&line->field_0x10;
  uVar7 = (uint)uVar17 & 0xffff;
  if ((uVar17 & 0xffff) == 0) {
    uVar11 = 0;
  }
  else {
    pbVar15 = (line->d).info;
    uVar11 = 0;
    do {
      if (pbVar15->key == uVar6) goto LAB_001249ef;
      uVar11 = uVar11 + 1;
      pbVar15 = pbVar15 + 1;
    } while ((uVar17 & 0xffff) != uVar11);
    uVar11 = (ulong)uVar7;
  }
LAB_001249ef:
  if ((uint)uVar11 == uVar7) {
    uVar17 = (ulong)((uint)(type == 0) * 3 - 3);
    goto switchD_00124ab3_caseD_4;
  }
  uVar17 = 1;
  if (type == 0) goto switchD_00124ab3_caseD_4;
  pbVar15 = (line->d).info;
  uVar11 = uVar11 & 0xffffffff;
  iVar18 = pbVar15[uVar11].len;
  b = (bcf1_t *)(long)iVar18;
  if (type == 3) {
    if (*ndst <= iVar18) {
      __size = (undefined1 *)((long)&b->rid + 1);
      *ndst = (int)__size;
      pvVar9 = realloc(*dst,(size_t)__size);
      *dst = pvVar9;
    }
    memcpy(*dst,pbVar15[uVar11].vptr,(long)pbVar15[uVar11].len);
    *(undefined1 *)((long)*dst + (long)pbVar15[uVar11].len) = 0;
    uVar17 = (ulong)(uint)pbVar15[uVar11].len;
    goto switchD_00124ab3_caseD_4;
  }
  if (*ndst < iVar18) {
    *ndst = iVar18;
    b = (bcf1_t *)((long)b << 2);
    pvVar9 = realloc(*dst,(size_t)b);
    *dst = pvVar9;
  }
  uVar5 = bcf_float_vector_end;
  uVar4 = bcf_float_missing;
  uVar6 = pbVar15[uVar11].type;
  h = (bcf_hdr_t *)(ulong)uVar6;
  uVar7 = pbVar15[uVar11].len;
  if ((ulong)uVar7 != 1) {
    plVar13 = (long *)(ulong)(uVar6 - 1);
    plVar14 = plVar13;
    if (uVar6 - 1 < 5) {
      plVar14 = (long *)((long)&switchD_00124ae3::switchdataD_00159f3c +
                        (long)(int)(&switchD_00124ae3::switchdataD_00159f3c)[(long)plVar13]);
      switch(plVar13) {
      case (long *)0x0:
        if (0 < pbVar15[uVar11].len) {
          puVar3 = pbVar15[uVar11].vptr;
          pvVar9 = *dst;
          uVar17 = 0;
          do {
            uVar1 = puVar3[uVar17];
            iVar18 = -0x80000000;
            if (uVar1 != 0x80) {
              if (uVar1 == 0x81) break;
              iVar18 = (int)(char)uVar1;
            }
            *(int *)((long)pvVar9 + uVar17 * 4) = iVar18;
            uVar17 = uVar17 + 1;
          } while ((long)uVar17 < (long)pbVar15[uVar11].len);
          goto switchD_00124ab3_caseD_4;
        }
        break;
      case (long *)0x1:
        if (0 < pbVar15[uVar11].len) {
          puVar3 = pbVar15[uVar11].vptr;
          pvVar9 = *dst;
          uVar17 = 0;
          do {
            sVar2 = *(short *)(puVar3 + uVar17 * 2);
            iVar18 = -0x80000000;
            if (sVar2 != -0x8000) {
              if (sVar2 == -0x7fff) break;
              iVar18 = (int)sVar2;
            }
            *(int *)((long)pvVar9 + uVar17 * 4) = iVar18;
            uVar17 = uVar17 + 1;
          } while ((long)uVar17 < (long)pbVar15[uVar11].len);
          goto switchD_00124ab3_caseD_4;
        }
        break;
      case (long *)0x2:
        if (0 < pbVar15[uVar11].len) {
          puVar3 = pbVar15[uVar11].vptr;
          pvVar9 = *dst;
          uVar17 = 0;
          do {
            if (*(int *)(puVar3 + uVar17 * 4) == -0x7fffffff) break;
            *(int *)((long)pvVar9 + uVar17 * 4) = *(int *)(puVar3 + uVar17 * 4);
            uVar17 = uVar17 + 1;
          } while ((long)uVar17 < (long)pbVar15[uVar11].len);
          goto switchD_00124ab3_caseD_4;
        }
        break;
      case (long *)0x3:
        goto switchD_00124ae3_caseD_3;
      case (long *)0x4:
        if (0 < (int)uVar7) {
          puVar3 = pbVar15[uVar11].vptr;
          pvVar9 = *dst;
          uVar17 = 0;
          do {
            uVar19 = *(uint32_t *)(puVar3 + uVar17 * 4);
            if (uVar5 == uVar19) goto switchD_00124ab3_caseD_4;
            if (uVar4 == uVar19) {
              uVar19 = uVar4;
            }
            *(uint32_t *)((long)pvVar9 + uVar17 * 4) = uVar19;
            uVar17 = uVar17 + 1;
          } while (uVar7 != uVar17);
          uVar17 = (ulong)uVar7;
          goto switchD_00124ab3_caseD_4;
        }
      }
      uVar17 = 0;
      goto switchD_00124ab3_caseD_4;
    }
switchD_00124ae3_caseD_3:
    bcf_get_info_values_cold_1();
    uVar6 = bcf_hdr_id2int(h,0,id);
    __size_00 = 0xffffffff;
    if ((((int)uVar6 < 0) || (uVar7 = (h->id[0][uVar6].val)->info[2], (~uVar7 & 0xf) == 0)) ||
       (__size_00 = 0xfffffffe, (uVar7 & 0xf0) != 0x30)) goto LAB_00124db5;
    if ((b->unpacked & 8) == 0) {
      bcf_unpack(b,8);
    }
    uVar17 = *(ulong *)&b->field_0x10;
    uVar7 = (uint)(uVar17 >> 0x20) & 0xff;
    if ((uVar17 & 0xff00000000) == 0) {
      uVar11 = 0;
    }
    else {
      pbVar16 = (b->d).fmt;
      uVar11 = 0;
      do {
        if (pbVar16->id == uVar6) goto LAB_00124cee;
        uVar11 = uVar11 + 1;
        pbVar16 = pbVar16 + 1;
      } while ((uVar17 >> 0x20 & 0xff) != uVar11);
      uVar11 = (ulong)uVar7;
    }
LAB_00124cee:
    __size_00 = 0xfffffffd;
    if ((uint)uVar11 == uVar7) goto LAB_00124db5;
    uVar11 = uVar11 & 0xffffffff;
    iVar18 = h->n[2];
    lVar22 = (long)iVar18;
    pbVar16 = (b->d).fmt;
    if (*plVar14 == 0) {
      puVar10 = (undefined8 *)malloc(lVar22 * 8);
      *plVar14 = (long)puVar10;
      if (puVar10 != (undefined8 *)0x0) {
        *puVar10 = 0;
        goto LAB_00124d34;
      }
LAB_00124daf:
      __size_00 = 0xfffffffc;
    }
    else {
LAB_00124d34:
      __size_00 = ((long)pbVar16[uVar11].n + 1) * lVar22;
      if (*piVar20 < (int)__size_00) {
        pvVar9 = realloc(*(void **)*plVar14,__size_00);
        *(void **)*plVar14 = pvVar9;
        if (*(long *)*plVar14 == 0) goto LAB_00124daf;
        *piVar20 = (int)__size_00;
      }
      if (0 < iVar18) {
        lVar21 = 0;
        do {
          iVar18 = pbVar16[uVar11].n;
          pvVar9 = (void *)((long)((iVar18 + 1) * (int)lVar21) + *(long *)*plVar14);
          memcpy(pvVar9,pbVar16[uVar11].p + iVar18 * (int)lVar21,(long)iVar18);
          *(undefined1 *)((long)pbVar16[uVar11].n + (long)pvVar9) = 0;
          *(void **)(*plVar14 + lVar21 * 8) = pvVar9;
          lVar21 = lVar21 + 1;
        } while (lVar22 != lVar21);
      }
    }
LAB_00124db5:
    return (int)__size_00;
  }
  switch(uVar6) {
  case 1:
    aVar8 = (anon_union_4_2_947300a4_for_v1)pbVar15[uVar11].v1.i;
    paVar12 = (anon_union_4_2_947300a4_for_v1 *)*dst;
    if (aVar8.i == -0x80) {
LAB_00124c0a:
      paVar12->i = -0x80000000;
      goto switchD_00124ab3_caseD_4;
    }
    break;
  case 2:
    aVar8 = (anon_union_4_2_947300a4_for_v1)pbVar15[uVar11].v1.i;
    paVar12 = (anon_union_4_2_947300a4_for_v1 *)*dst;
    if (aVar8.i == -0x8000) goto LAB_00124c0a;
    break;
  case 3:
    aVar8 = pbVar15[uVar11].v1;
    paVar12 = (anon_union_4_2_947300a4_for_v1 *)*dst;
    break;
  default:
    goto switchD_00124ab3_caseD_4;
  case 5:
    *(anon_union_4_2_947300a4_for_v1 *)*dst = pbVar15[uVar11].v1;
    goto switchD_00124ab3_caseD_4;
  }
  *paVar12 = aVar8;
switchD_00124ab3_caseD_4:
  return (int)uVar17;
}

Assistant:

int bcf_get_info_values(const bcf_hdr_t *hdr, bcf1_t *line, const char *tag, void **dst, int *ndst, int type)
{
    int i,j, tag_id = bcf_hdr_id2int(hdr, BCF_DT_ID, tag);
    if ( !bcf_hdr_idinfo_exists(hdr,BCF_HL_INFO,tag_id) ) return -1;    // no such INFO field in the header
    if ( bcf_hdr_id2type(hdr,BCF_HL_INFO,tag_id)!=type ) return -2;     // expected different type

    if ( !(line->unpacked & BCF_UN_INFO) ) bcf_unpack(line, BCF_UN_INFO);

    for (i=0; i<line->n_info; i++)
        if ( line->d.info[i].key==tag_id ) break;
    if ( i==line->n_info ) return ( type==BCF_HT_FLAG ) ? 0 : -3;       // the tag is not present in this record
    if ( type==BCF_HT_FLAG ) return 1;

    bcf_info_t *info = &line->d.info[i];
    if ( type==BCF_HT_STR )
    {
        if ( *ndst < info->len+1 )
        {
            *ndst = info->len + 1;
            *dst  = realloc(*dst, *ndst);
        }
        memcpy(*dst,info->vptr,info->len);
        ((uint8_t*)*dst)[info->len] = 0;
        return info->len;
    }

    // Make sure the buffer is big enough
    int size1 = type==BCF_HT_INT ? sizeof(int32_t) : sizeof(float);
    if ( *ndst < info->len )
    {
        *ndst = info->len;
        *dst  = realloc(*dst, *ndst * size1);
    }

    if ( info->len == 1 )
    {
        if ( info->type==BCF_BT_FLOAT ) *((float*)*dst) = info->v1.f;
        else 
        {
            #define BRANCH(type_t, missing) { \
                if ( info->v1.i==missing ) *((int32_t*)*dst) = bcf_int32_missing; \
                else *((int32_t*)*dst) = info->v1.i; \
            }
            switch (info->type)
            {
                case BCF_BT_INT8:  BRANCH(int8_t,  bcf_int8_missing ); break;
                case BCF_BT_INT16: BRANCH(int16_t, bcf_int16_missing); break;
                case BCF_BT_INT32: BRANCH(int32_t, bcf_int32_missing); break;
            }
            #undef BRANCH
        }
        return 1;
    }

    #define BRANCH(type_t, is_missing, is_vector_end, set_missing, out_type_t) { \
        out_type_t *tmp = (out_type_t *) *dst; \
        type_t *p = (type_t *) info->vptr; \
        for (j=0; j<info->len; j++) \
        { \
            if ( is_vector_end ) return j; \
            if ( is_missing ) set_missing; \
            else *tmp = p[j]; \
            tmp++; \
        } \
        return j; \
    }
    switch (info->type) {
        case BCF_BT_INT8:  BRANCH(int8_t,  p[j]==bcf_int8_missing,  p[j]==bcf_int8_vector_end,  *tmp=bcf_int32_missing, int32_t); break;
        case BCF_BT_INT16: BRANCH(int16_t, p[j]==bcf_int16_missing, p[j]==bcf_int16_vector_end, *tmp=bcf_int32_missing, int32_t); break;
        case BCF_BT_INT32: BRANCH(int32_t, p[j]==bcf_int32_missing, p[j]==bcf_int32_vector_end, *tmp=bcf_int32_missing, int32_t); break;
        case BCF_BT_FLOAT: BRANCH(float,   bcf_float_is_missing(p[j]), bcf_float_is_vector_end(p[j]), bcf_float_set_missing(*tmp), float); break;
        default: fprintf(stderr,"TODO: %s:%d .. info->type=%d\n", __FILE__,__LINE__, info->type); exit(1);
    }
    #undef BRANCH
    return -4;  // this can never happen
}